

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorConstrainedPOMDP.cpp
# Opt level: O1

AlphaVector * __thiscall
AlphaVectorConstrainedPOMDP::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorConstrainedPOMDP *this,
          JointBeliefInterface *b,Index a,GaoVectorSet *G)

{
  undefined1 auVar1 [16];
  _func_int *p_Var2;
  VectorSet *v;
  long *plVar3;
  pointer pdVar4;
  pointer pdVar5;
  AlphaVector *pAVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  PlanningUnitMADPDiscrete *this_00;
  size_t sVar12;
  double dVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  AlphaVector *newVector;
  vector<double,_std::allocator<double>_> Gab;
  string local_a0;
  AlphaVector *local_80;
  vector<double,_std::allocator<double>_> local_78;
  size_type local_60;
  long local_58;
  size_t local_50;
  ulong local_48;
  JointBeliefInterface *local_40;
  GaoVectorSet *local_38;
  undefined1 extraout_var [56];
  
  lVar11 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  if (lVar11 == 0) {
    lVar11 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  }
  local_80 = __return_storage_ptr__;
  local_40 = b;
  local_38 = G;
  iVar7 = (**(code **)(**(long **)(lVar11 + 0x30) + 200))();
  this_00 = *(PlanningUnitMADPDiscrete **)
             (&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
  }
  sVar8 = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  p_Var2 = this->_vptr_AlphaVectorConstrainedPOMDP[-3];
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeliefBackupPOMDP","");
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorConstrainedPOMDP + (long)p_Var2),
             &local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_60 = (size_type)(int)sVar8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,local_60,(allocator_type *)&local_a0);
  if ((int)sVar8 != 0) {
    uVar10 = 0;
    do {
      lVar11 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
      if (lVar11 == 0) {
        lVar11 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
      }
      dVar13 = (double)(**(code **)(**(long **)(lVar11 + 0x330) + 0xc0))
                                 (*(long **)(lVar11 + 0x330),uVar10 & 0xffffffff,a);
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = dVar13;
      uVar10 = uVar10 + 1;
    } while ((sVar8 & 0xffffffff) != uVar10);
  }
  sVar12 = sVar8;
  if (iVar7 != 0) {
    local_58 = (long)iVar7;
    local_48 = (ulong)a;
    lVar11 = 0;
    local_50 = sVar8;
    do {
      sVar12 = local_50;
      v = (local_38->
          super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
          ).
          super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
          .base_[(local_38->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .origin_offset_ +
                 (local_38->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[0] * local_48 +
                 (local_38->
                 super_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL>
                 ).
                 super_const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
                 .stride_list_.elems[1] * lVar11];
      iVar7 = BeliefValue::GetMaximizingVectorIndex
                        ((BeliefInterface *)
                         ((long)&local_40->field_0x0 + *(long *)((long)*local_40 + -0xb8)),v);
      if ((int)sVar12 != 0) {
        uVar10 = 0;
        do {
          lVar9 = *(long *)(&this->field_0x10 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3]);
          if (lVar9 == 0) {
            lVar9 = *(long *)(&this->field_0x18 + (long)this->_vptr_AlphaVectorConstrainedPOMDP[-3])
            ;
          }
          plVar3 = *(long **)(lVar9 + 0x330);
          auVar14._0_8_ =
               (**(code **)(*(long *)((long)plVar3 + *(long *)(*plVar3 + -0xb0)) + 0x70))
                         ((long)plVar3 + *(long *)(*plVar3 + -0xb0));
          auVar14._8_56_ = extraout_var;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = (v->data_).data_[v->size2_ * (long)iVar7 + uVar10];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10];
          auVar1 = vfmadd213sd_fma(auVar15,auVar14._0_16_,auVar1);
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = auVar1._0_8_;
          uVar10 = uVar10 + 1;
        } while ((sVar8 & 0xffffffff) != uVar10);
      }
      lVar11 = lVar11 + 1;
      sVar12 = local_50;
    } while (lVar11 != local_58);
  }
  pAVar6 = local_80;
  AlphaVector::AlphaVector(local_80,local_60);
  pAVar6->_m_action = a;
  if ((int)sVar12 != 0) {
    pdVar4 = (pAVar6->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (pAVar6->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar10 = 0;
    do {
      if ((long)pdVar5 - (long)pdVar4 >> 3 == uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      pdVar4[uVar10] =
           local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      uVar10 = uVar10 + 1;
    } while ((sVar12 & 0xffffffff) != uVar10);
  }
  p_Var2 = this->_vptr_AlphaVectorConstrainedPOMDP[-3];
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeliefBackupPOMDP","");
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)((long)&this->_vptr_AlphaVectorConstrainedPOMDP + (long)p_Var2),
             &local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pAVar6;
}

Assistant:

AlphaVector AlphaVectorConstrainedPOMDP::BeliefBackup(const JointBeliefInterface &b,
                                                      Index a,
                                                      const GaoVectorSet &G) const
{
    int nrO=GetPU()->GetNrJointObservations(),
        nrS=GetPU()->GetNrStates();
    VectorSet *VS;
    // stores the index of the vector that maximizes b's value
    int maximizingVectorI;

    StartTimer("BeliefBackupPOMDP");

    vector<double> Gab(nrS);

    // initialize Gab vector with the immediate reward
    for(int s=0;s!=nrS;s++)
        Gab[s]=GetPU()->GetReward(s,a);
    
    for(GaoVectorSetIndex o=0;o!=nrO;o++)
    {
        VS=G[a][o];
        maximizingVectorI=BeliefValue::GetMaximizingVectorIndex(b,*VS);
        
        // add discounted maximizing vector (3.16)
        for(int s=0;s!=nrS;s++)
            Gab[s]+=GetPU()->GetDiscount()*
                (*VS)(maximizingVectorI,s);
    }

    // create the vector for b
    AlphaVector newVector(nrS);
    newVector.SetAction(a);
    for(int s=0;s!=nrS;s++)
        newVector.SetValue(Gab[s],s);

    StopTimer("BeliefBackupPOMDP");

    return(newVector);
}